

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorFunction.cpp
# Opt level: O2

bool ColorFunction::checkCollision(ColorCircle *clr1,ColorCircle *clr2)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  iVar1 = Colored::_state(&clr1->super_Colored);
  if ((iVar1 == 1) && (iVar1 = Colored::_state(&clr2->super_Colored), iVar1 == 1)) {
    (**(clr1->super_Colored)._vptr_Colored)(0,clr1);
    (**(clr2->super_Colored)._vptr_Colored)(0,clr2);
    auVar7._8_8_ = extraout_XMM0_Qa_00;
    auVar7._0_8_ = extraout_XMM0_Qa;
    auVar7 = divpd(auVar7,_DAT_00115300);
    dVar3 = auVar7._8_8_;
    if (auVar7._0_8_ <= auVar7._8_8_) {
      dVar3 = auVar7._0_8_;
    }
    dVar2 = 1.0;
    if (dVar3 <= 1.0) {
      dVar2 = dVar3;
    }
    dVar3 = Colored::_x(&clr1->super_Colored);
    dVar4 = Colored::_x(&clr2->super_Colored);
    dVar5 = Colored::_y(&clr1->super_Colored);
    dVar6 = Colored::_y(&clr2->super_Colored);
    return SQRT((dVar6 - dVar5) * (dVar6 - dVar5) + (dVar4 - dVar3) * (dVar4 - dVar3)) <
           (extraout_XMM0_Qa + extraout_XMM0_Qa_00) -
           (double)((-(ulong)(extraout_XMM0_Qa_00 < 1.5) & 0xbff0000000000000 |
                    ~-(ulong)(extraout_XMM0_Qa_00 < 1.5) & (ulong)dVar2) &
                    -(ulong)(extraout_XMM0_Qa < 1.5) |
                   ~-(ulong)(extraout_XMM0_Qa < 1.5) & (ulong)dVar2);
  }
  return false;
}

Assistant:

bool ColorFunction::checkCollision(ColorCircle* clr1, ColorCircle* clr2){
    
    bool flag_collision = false;
    
    if(clr1->_state()==1 && clr2->_state()==1){
        double rho1 = clr1->getRho();
        double rho2 = clr2->getRho();
        
        double threshold = rho1 / 5;
        if( threshold > rho2 / 5){
            threshold = rho2 / 5;
        }
        if( threshold > 1 ){
            threshold = 1;
        }
        
        if(rho1 < 1.5 && rho2 < 1.5){
            threshold = -1;
        }
        
        double x1 = clr1->_x();
        double x2 = clr2->_x();
        double y1 = clr1->_y();
        double y2 = clr2->_y();
        
        double dist = sqrt( (y2 - y1)*(y2 - y1) + (x2 - x1)*(x2 - x1) );
        if( dist < rho1 + rho2 - threshold ){
            flag_collision = true;
            //                printf("(%.2f, %.2f, %.2f, %.2f, %.2f, %.2f, %.2f)\n", x1,y1,x2,y2,rho1,rho2,dist);
        }
    }
    
    return flag_collision;
}